

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::tracker_connection::tracker_connection
          (tracker_connection *this,tracker_manager *man,tracker_request *req,io_context *ios,
          weak_ptr<libtorrent::aux::request_callback> *r)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  timeout_handler::timeout_handler(&this->super_timeout_handler,ios);
  (this->super_timeout_handler)._vptr_timeout_handler =
       (_func_int **)&PTR___cxa_pure_virtual_004c9ee8;
  tracker_request::tracker_request(&this->m_req,req);
  p_Var1 = (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_requester).
  super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->m_requester).
  super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_man = man;
  return;
}

Assistant:

tracker_connection::tracker_connection(
		tracker_manager& man
		, tracker_request req
		, io_context& ios
		, std::weak_ptr<request_callback> r)
		: timeout_handler(ios)
		, m_req(std::move(req))
		, m_requester(std::move(r))
		, m_man(man)
	{}